

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_components.c
# Opt level: O2

void key_components_free(key_components *kc)

{
  uint uVar1;
  key_component *ptr;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0x10;
  uVar2 = 0;
  do {
    ptr = kc->components;
    if (kc->ncomponents <= uVar2) {
      safefree(ptr);
      safefree(kc);
      return;
    }
    safefree(*(void **)((long)ptr + lVar3 + -0x10));
    uVar1 = *(uint *)((long)ptr + lVar3 + -8);
    if (uVar1 < 2) {
      strbuf_free(*(strbuf **)((long)&ptr->name + lVar3));
    }
    else {
      if (uVar1 != 2) {
        __assert_fail("false && \"bad key component type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/key_components.c"
                      ,0x58,"void key_components_free(key_components *)");
      }
      mp_free(*(mp_int **)((long)&ptr->name + lVar3));
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  } while( true );
}

Assistant:

void key_components_free(key_components *kc)
{
    for (size_t i = 0; i < kc->ncomponents; i++) {
        key_component *comp = &kc->components[i];
        sfree(comp->name);
        switch (comp->type) {
          case KCT_MPINT:
            mp_free(comp->mp);
            break;
          case KCT_TEXT:
          case KCT_BINARY:
            strbuf_free(comp->str);
            break;
          default:
            unreachable("bad key component type");
        }
    }
    sfree(kc->components);
    sfree(kc);
}